

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

void insert_helper<QStringView>(QString *str,qsizetype i,QStringView *toInsert)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  char16_t *b;
  QArrayData *data;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  qsizetype qVar19;
  ulong uVar20;
  size_t __n;
  difference_type __d_1;
  long lVar21;
  long lVar22;
  char16_t *char16String_1;
  char16_t *b_00;
  char16_t *char16String;
  long lVar23;
  long in_FS_OFFSET;
  int iVar27;
  undefined1 auVar24 [16];
  int iVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  int iVar57;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar58;
  int iVar61;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar66 [16];
  undefined1 local_58 [16];
  ulong local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar22 = (str->d).size;
  lVar23 = i - lVar22;
  if (lVar23 == 0 || i < lVar22) {
    lVar23 = 0;
  }
  lVar1 = toInsert->m_size;
  lVar21 = lVar1 + lVar23 + lVar22;
  pDVar2 = (str->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(str->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) <
      lVar21)) {
    pcVar3 = (str->d).ptr;
    b_00 = pcVar3 + i;
    if (lVar23 != 0) {
      b_00 = pcVar3 + lVar22;
    }
    local_58 = (undefined1  [16])0x0;
    local_48 = 0;
    QArrayDataPointer<char16_t>::detachAndGrow
              ((QArrayDataPointer<char16_t> *)local_58,(uint)(i == 0),lVar21,(char16_t **)0x0,
               (QArrayDataPointer<char16_t> *)0x0);
    if ((pcVar3 != (char16_t *)0x0) && (0 < (long)b_00 - (long)pcVar3)) {
      QtPrivate::QCommonArrayOps<char16_t>::growAppend
                ((QCommonArrayOps<char16_t> *)local_58,pcVar3,
                 (char16_t *)(((long)b_00 - (long)pcVar3) + (long)pcVar3));
      *(char16_t *)(local_58._8_8_ + local_48 * 2) = L'\0';
    }
    uVar20 = local_48;
    QString::resize((QString *)local_58,i);
    auVar17 = _DAT_00176180;
    auVar16 = _DAT_00176170;
    auVar15 = _DAT_00176160;
    auVar14 = _DAT_00176150;
    auVar13 = _DAT_00176140;
    if (uVar20 < local_48) {
      uVar18 = (local_48 * 2 + uVar20 * -2) - 2;
      auVar32._8_4_ = (int)uVar18;
      auVar32._0_8_ = uVar18;
      auVar32._12_4_ = (int)(uVar18 >> 0x20);
      auVar24._0_8_ = uVar18 >> 1;
      auVar24._8_8_ = auVar32._8_8_ >> 1;
      lVar23 = 0;
      auVar24 = auVar24 ^ _DAT_00176180;
      do {
        auVar40._8_4_ = (int)lVar23;
        auVar40._0_8_ = lVar23;
        auVar40._12_4_ = (int)((ulong)lVar23 >> 0x20);
        auVar32 = (auVar40 | auVar16) ^ auVar17;
        iVar48 = auVar24._0_4_;
        iVar58 = -(uint)(iVar48 < auVar32._0_4_);
        iVar27 = auVar24._4_4_;
        auVar33._4_4_ = -(uint)(iVar27 < auVar32._4_4_);
        iVar57 = auVar24._8_4_;
        iVar61 = -(uint)(iVar57 < auVar32._8_4_);
        iVar28 = auVar24._12_4_;
        auVar33._12_4_ = -(uint)(iVar28 < auVar32._12_4_);
        auVar49._4_4_ = iVar58;
        auVar49._0_4_ = iVar58;
        auVar49._8_4_ = iVar61;
        auVar49._12_4_ = iVar61;
        auVar62 = pshuflw(in_XMM11,auVar49,0xe8);
        auVar35._4_4_ = -(uint)(auVar32._4_4_ == iVar27);
        auVar35._12_4_ = -(uint)(auVar32._12_4_ == iVar28);
        auVar35._0_4_ = auVar35._4_4_;
        auVar35._8_4_ = auVar35._12_4_;
        auVar66 = pshuflw(in_XMM12,auVar35,0xe8);
        auVar33._0_4_ = auVar33._4_4_;
        auVar33._8_4_ = auVar33._12_4_;
        auVar32 = pshuflw(auVar62,auVar33,0xe8);
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar63 = (auVar32 | auVar66 & auVar62) ^ auVar63;
        auVar32 = packssdw(auVar63,auVar63);
        if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar20 + lVar23) * 2) = L' ';
        }
        auVar33 = auVar35 & auVar49 | auVar33;
        auVar32 = packssdw(auVar33,auVar33);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 ^ auVar4,auVar32 ^ auVar4);
        if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
          *(char16_t *)(local_58._8_8_ + (uVar20 + lVar23 + 1) * 2) = L' ';
        }
        auVar32 = (auVar40 | auVar15) ^ auVar17;
        iVar58 = -(uint)(iVar48 < auVar32._0_4_);
        auVar59._4_4_ = -(uint)(iVar27 < auVar32._4_4_);
        iVar61 = -(uint)(iVar57 < auVar32._8_4_);
        auVar59._12_4_ = -(uint)(iVar28 < auVar32._12_4_);
        auVar34._4_4_ = iVar58;
        auVar34._0_4_ = iVar58;
        auVar34._8_4_ = iVar61;
        auVar34._12_4_ = iVar61;
        auVar50._4_4_ = -(uint)(auVar32._4_4_ == iVar27);
        auVar50._12_4_ = -(uint)(auVar32._12_4_ == iVar28);
        auVar50._0_4_ = auVar50._4_4_;
        auVar50._8_4_ = auVar50._12_4_;
        auVar59._0_4_ = auVar59._4_4_;
        auVar59._8_4_ = auVar59._12_4_;
        auVar32 = auVar50 & auVar34 | auVar59;
        auVar32 = packssdw(auVar32,auVar32);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 ^ auVar5,auVar32 ^ auVar5);
        if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar20 + lVar23 + 2) * 2) = L' ';
        }
        auVar63 = pshufhw(auVar34,auVar34,0x84);
        auVar33 = pshufhw(auVar50,auVar50,0x84);
        auVar35 = pshufhw(auVar63,auVar59,0x84);
        auVar36._8_4_ = 0xffffffff;
        auVar36._0_8_ = 0xffffffffffffffff;
        auVar36._12_4_ = 0xffffffff;
        auVar36 = (auVar35 | auVar33 & auVar63) ^ auVar36;
        auVar63 = packssdw(auVar36,auVar36);
        if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar20 + lVar23 + 3) * 2) = L' ';
        }
        auVar63 = (auVar40 | auVar14) ^ auVar17;
        iVar58 = -(uint)(iVar48 < auVar63._0_4_);
        auVar38._4_4_ = -(uint)(iVar27 < auVar63._4_4_);
        iVar61 = -(uint)(iVar57 < auVar63._8_4_);
        auVar38._12_4_ = -(uint)(iVar28 < auVar63._12_4_);
        auVar51._4_4_ = iVar58;
        auVar51._0_4_ = iVar58;
        auVar51._8_4_ = iVar61;
        auVar51._12_4_ = iVar61;
        auVar32 = pshuflw(auVar32,auVar51,0xe8);
        auVar37._4_4_ = -(uint)(auVar63._4_4_ == iVar27);
        auVar37._12_4_ = -(uint)(auVar63._12_4_ == iVar28);
        auVar37._0_4_ = auVar37._4_4_;
        auVar37._8_4_ = auVar37._12_4_;
        in_XMM12 = pshuflw(auVar66 & auVar62,auVar37,0xe8);
        in_XMM12 = in_XMM12 & auVar32;
        auVar38._0_4_ = auVar38._4_4_;
        auVar38._8_4_ = auVar38._12_4_;
        auVar32 = pshuflw(auVar32,auVar38,0xe8);
        auVar62._8_4_ = 0xffffffff;
        auVar62._0_8_ = 0xffffffffffffffff;
        auVar62._12_4_ = 0xffffffff;
        auVar62 = (auVar32 | in_XMM12) ^ auVar62;
        in_XMM11 = packssdw(auVar62,auVar62);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar20 + lVar23 + 4) * 2) = L' ';
        }
        auVar38 = auVar37 & auVar51 | auVar38;
        auVar32 = packssdw(auVar38,auVar38);
        auVar66._8_4_ = 0xffffffff;
        auVar66._0_8_ = 0xffffffffffffffff;
        auVar66._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 ^ auVar66,auVar32 ^ auVar66);
        if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar20 + lVar23 + 5) * 2) = L' ';
        }
        auVar32 = (auVar40 | auVar13) ^ auVar17;
        iVar48 = -(uint)(iVar48 < auVar32._0_4_);
        auVar52._4_4_ = -(uint)(iVar27 < auVar32._4_4_);
        iVar57 = -(uint)(iVar57 < auVar32._8_4_);
        auVar52._12_4_ = -(uint)(iVar28 < auVar32._12_4_);
        auVar39._4_4_ = iVar48;
        auVar39._0_4_ = iVar48;
        auVar39._8_4_ = iVar57;
        auVar39._12_4_ = iVar57;
        auVar29._4_4_ = -(uint)(auVar32._4_4_ == iVar27);
        auVar29._12_4_ = -(uint)(auVar32._12_4_ == iVar28);
        auVar29._0_4_ = auVar29._4_4_;
        auVar29._8_4_ = auVar29._12_4_;
        auVar52._0_4_ = auVar52._4_4_;
        auVar52._8_4_ = auVar52._12_4_;
        auVar32 = auVar29 & auVar39 | auVar52;
        auVar32 = packssdw(auVar32,auVar32);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 ^ auVar6,auVar32 ^ auVar6);
        if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar20 + lVar23 + 6) * 2) = L' ';
        }
        auVar63 = pshufhw(auVar39,auVar39,0x84);
        auVar32 = pshufhw(auVar29,auVar29,0x84);
        auVar40 = pshufhw(auVar63,auVar52,0x84);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 & auVar63,(auVar40 | auVar32 & auVar63) ^ auVar7);
        if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(char16_t *)(local_58._8_8_ + (uVar20 + lVar23 + 7) * 2) = L' ';
        }
        lVar23 = lVar23 + 8;
      } while ((uVar18 >> 4) * 8 + 8 != lVar23);
    }
    b = toInsert->m_data;
    if (0 < toInsert->m_size && b != (char16_t *)0x0) {
      QtPrivate::QCommonArrayOps<char16_t>::growAppend
                ((QCommonArrayOps<char16_t> *)local_58,b,b + toInsert->m_size);
      *(char16_t *)(local_58._8_8_ + local_48 * 2) = L'\0';
    }
    if ((b_00 != (char16_t *)0x0) && (lVar22 = (long)(pcVar3 + lVar22) - (long)b_00, 0 < lVar22)) {
      QtPrivate::QCommonArrayOps<char16_t>::growAppend
                ((QCommonArrayOps<char16_t> *)local_58,b_00,(char16_t *)(lVar22 + (long)b_00));
      *(char16_t *)(local_58._8_8_ + local_48 * 2) = L'\0';
    }
    data = &((str->d).d)->super_QArrayData;
    auVar13._0_8_ = (str->d).d;
    auVar13._8_8_ = (str->d).ptr;
    (str->d).d = (Data *)local_58._0_8_;
    (str->d).ptr = (char16_t *)local_58._8_8_;
    qVar19 = (str->d).size;
    (str->d).size = local_48;
    local_58 = auVar13;
    local_48 = qVar19;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  else {
    QArrayDataPointer<char16_t>::detachAndGrow
              (&str->d,(uint)(i == 0),lVar1 + lVar23,(char16_t **)0x0,
               (QArrayDataPointer<char16_t> *)0x0);
    QString::resize(str,lVar21);
    auVar17 = _DAT_00176180;
    auVar16 = _DAT_00176170;
    auVar15 = _DAT_00176160;
    auVar14 = _DAT_00176150;
    auVar13 = _DAT_00176140;
    pcVar3 = (str->d).ptr;
    if (0 < lVar23) {
      qVar19 = i;
      if (i < lVar22) {
        qVar19 = lVar22;
      }
      uVar20 = (qVar19 * 2 + lVar22 * -2) - 2;
      auVar25._8_4_ = (int)uVar20;
      auVar25._0_8_ = uVar20;
      auVar25._12_4_ = (int)(uVar20 >> 0x20);
      auVar26._0_8_ = uVar20 >> 1;
      auVar26._8_8_ = auVar25._8_8_ >> 1;
      lVar21 = 0;
      auVar26 = auVar26 ^ _DAT_00176180;
      do {
        auVar30._8_4_ = (int)lVar21;
        auVar30._0_8_ = lVar21;
        auVar30._12_4_ = (int)((ulong)lVar21 >> 0x20);
        auVar32 = (auVar30 | auVar16) ^ auVar17;
        iVar48 = auVar26._0_4_;
        iVar58 = -(uint)(iVar48 < auVar32._0_4_);
        iVar27 = auVar26._4_4_;
        auVar42._4_4_ = -(uint)(iVar27 < auVar32._4_4_);
        iVar57 = auVar26._8_4_;
        iVar61 = -(uint)(iVar57 < auVar32._8_4_);
        iVar28 = auVar26._12_4_;
        auVar42._12_4_ = -(uint)(iVar28 < auVar32._12_4_);
        auVar53._4_4_ = iVar58;
        auVar53._0_4_ = iVar58;
        auVar53._8_4_ = iVar61;
        auVar53._12_4_ = iVar61;
        auVar24 = pshuflw(in_XMM11,auVar53,0xe8);
        auVar41._4_4_ = -(uint)(auVar32._4_4_ == iVar27);
        auVar41._12_4_ = -(uint)(auVar32._12_4_ == iVar28);
        auVar41._0_4_ = auVar41._4_4_;
        auVar41._8_4_ = auVar41._12_4_;
        auVar63 = pshuflw(in_XMM12,auVar41,0xe8);
        auVar42._0_4_ = auVar42._4_4_;
        auVar42._8_4_ = auVar42._12_4_;
        auVar32 = pshuflw(auVar24,auVar42,0xe8);
        auVar64._8_4_ = 0xffffffff;
        auVar64._0_8_ = 0xffffffffffffffff;
        auVar64._12_4_ = 0xffffffff;
        auVar64 = (auVar32 | auVar63 & auVar24) ^ auVar64;
        auVar32 = packssdw(auVar64,auVar64);
        if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar3[lVar22 + lVar21] = L' ';
        }
        auVar42 = auVar41 & auVar53 | auVar42;
        auVar32 = packssdw(auVar42,auVar42);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 ^ auVar8,auVar32 ^ auVar8);
        if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
          pcVar3[lVar22 + lVar21 + 1] = L' ';
        }
        auVar32 = (auVar30 | auVar15) ^ auVar17;
        iVar58 = -(uint)(iVar48 < auVar32._0_4_);
        auVar60._4_4_ = -(uint)(iVar27 < auVar32._4_4_);
        iVar61 = -(uint)(iVar57 < auVar32._8_4_);
        auVar60._12_4_ = -(uint)(iVar28 < auVar32._12_4_);
        auVar43._4_4_ = iVar58;
        auVar43._0_4_ = iVar58;
        auVar43._8_4_ = iVar61;
        auVar43._12_4_ = iVar61;
        auVar54._4_4_ = -(uint)(auVar32._4_4_ == iVar27);
        auVar54._12_4_ = -(uint)(auVar32._12_4_ == iVar28);
        auVar54._0_4_ = auVar54._4_4_;
        auVar54._8_4_ = auVar54._12_4_;
        auVar60._0_4_ = auVar60._4_4_;
        auVar60._8_4_ = auVar60._12_4_;
        auVar32 = auVar54 & auVar43 | auVar60;
        auVar32 = packssdw(auVar32,auVar32);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 ^ auVar9,auVar32 ^ auVar9);
        if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pcVar3[lVar22 + lVar21 + 2] = L' ';
        }
        auVar40 = pshufhw(auVar43,auVar43,0x84);
        auVar33 = pshufhw(auVar54,auVar54,0x84);
        auVar35 = pshufhw(auVar40,auVar60,0x84);
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar44 = (auVar35 | auVar33 & auVar40) ^ auVar44;
        auVar40 = packssdw(auVar44,auVar44);
        if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pcVar3[lVar22 + lVar21 + 3] = L' ';
        }
        auVar40 = (auVar30 | auVar14) ^ auVar17;
        iVar58 = -(uint)(iVar48 < auVar40._0_4_);
        auVar46._4_4_ = -(uint)(iVar27 < auVar40._4_4_);
        iVar61 = -(uint)(iVar57 < auVar40._8_4_);
        auVar46._12_4_ = -(uint)(iVar28 < auVar40._12_4_);
        auVar55._4_4_ = iVar58;
        auVar55._0_4_ = iVar58;
        auVar55._8_4_ = iVar61;
        auVar55._12_4_ = iVar61;
        auVar32 = pshuflw(auVar32,auVar55,0xe8);
        auVar45._4_4_ = -(uint)(auVar40._4_4_ == iVar27);
        auVar45._12_4_ = -(uint)(auVar40._12_4_ == iVar28);
        auVar45._0_4_ = auVar45._4_4_;
        auVar45._8_4_ = auVar45._12_4_;
        in_XMM12 = pshuflw(auVar63 & auVar24,auVar45,0xe8);
        in_XMM12 = in_XMM12 & auVar32;
        auVar46._0_4_ = auVar46._4_4_;
        auVar46._8_4_ = auVar46._12_4_;
        auVar32 = pshuflw(auVar32,auVar46,0xe8);
        auVar65._8_4_ = 0xffffffff;
        auVar65._0_8_ = 0xffffffffffffffff;
        auVar65._12_4_ = 0xffffffff;
        auVar65 = (auVar32 | in_XMM12) ^ auVar65;
        in_XMM11 = packssdw(auVar65,auVar65);
        if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar3[lVar22 + lVar21 + 4] = L' ';
        }
        auVar46 = auVar45 & auVar55 | auVar46;
        auVar32 = packssdw(auVar46,auVar46);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 ^ auVar10,auVar32 ^ auVar10);
        if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pcVar3[lVar22 + lVar21 + 5] = L' ';
        }
        auVar32 = (auVar30 | auVar13) ^ auVar17;
        iVar48 = -(uint)(iVar48 < auVar32._0_4_);
        auVar56._4_4_ = -(uint)(iVar27 < auVar32._4_4_);
        iVar57 = -(uint)(iVar57 < auVar32._8_4_);
        auVar56._12_4_ = -(uint)(iVar28 < auVar32._12_4_);
        auVar47._4_4_ = iVar48;
        auVar47._0_4_ = iVar48;
        auVar47._8_4_ = iVar57;
        auVar47._12_4_ = iVar57;
        auVar31._4_4_ = -(uint)(auVar32._4_4_ == iVar27);
        auVar31._12_4_ = -(uint)(auVar32._12_4_ == iVar28);
        auVar31._0_4_ = auVar31._4_4_;
        auVar31._8_4_ = auVar31._12_4_;
        auVar56._0_4_ = auVar56._4_4_;
        auVar56._8_4_ = auVar56._12_4_;
        auVar32 = auVar31 & auVar47 | auVar56;
        auVar32 = packssdw(auVar32,auVar32);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 ^ auVar11,auVar32 ^ auVar11);
        if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pcVar3[lVar22 + lVar21 + 6] = L' ';
        }
        auVar24 = pshufhw(auVar47,auVar47,0x84);
        auVar32 = pshufhw(auVar31,auVar31,0x84);
        auVar63 = pshufhw(auVar24,auVar56,0x84);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 & auVar24,(auVar63 | auVar32 & auVar24) ^ auVar12);
        if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pcVar3[lVar22 + lVar21 + 7] = L' ';
        }
        lVar21 = lVar21 + 8;
      } while ((uVar20 >> 4) * 8 + 8 != lVar21);
    }
    if (i != lVar22 && lVar23 == 0) {
      __n = lVar22 * 2 + i * -2;
      memmove((void *)((long)pcVar3 + ((str->d).size * 2 - __n)),pcVar3 + i,__n);
    }
    if (0 < lVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        memmove(pcVar3 + i,toInsert->m_data,lVar1 * 2);
        return;
      }
      goto LAB_0015b8ea;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0015b8ea:
  __stack_chk_fail();
}

Assistant:

static void insert_helper(QString &str, qsizetype i, const T &toInsert)
{
    auto &str_d = str.data_ptr();
    qsizetype difference = 0;
    if (Q_UNLIKELY(i > str_d.size))
        difference = i - str_d.size;
    const qsizetype oldSize = str_d.size;
    const qsizetype insert_size = toInsert.size();
    const qsizetype newSize = str_d.size + difference + insert_size;
    const auto side = i == 0 ? QArrayData::GrowsAtBeginning : QArrayData::GrowsAtEnd;

    if (str_d.needsDetach() || needsReallocate(str, newSize)) {
        const auto cbegin = str.cbegin();
        const auto cend = str.cend();
        const auto insert_start = difference == 0 ? std::next(cbegin, i) : cend;
        QString other;
        // Using detachAndGrow() so that prepend optimization works and QStringBuilder
        // unittests pass
        other.data_ptr().detachAndGrow(side, newSize, nullptr, nullptr);
        other.append(QStringView(cbegin, insert_start));
        other.resize(i, u' ');
        other.append(toInsert);
        other.append(QStringView(insert_start, cend));
        str.swap(other);
        return;
    }

    str_d.detachAndGrow(side, difference + insert_size, nullptr, nullptr);
    Q_CHECK_PTR(str_d.data());
    str.resize(newSize);

    auto begin = str_d.begin();
    auto old_end = std::next(begin, oldSize);
    std::fill_n(old_end, difference, u' ');
    auto insert_start = std::next(begin, i);
    if (difference == 0)
        std::move_backward(insert_start, old_end, str_d.end());

    using Char = std::remove_cv_t<typename T::value_type>;
    if constexpr(std::is_same_v<Char, QChar>)
        std::copy_n(reinterpret_cast<const char16_t *>(toInsert.data()), insert_size, insert_start);
    else if constexpr (std::is_same_v<Char, char16_t>)
        std::copy_n(toInsert.data(), insert_size, insert_start);
    else if constexpr (std::is_same_v<Char, char>)
        qt_from_latin1(insert_start, toInsert.data(), insert_size);
}